

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O2

int __thiscall
beagle::cpu::BeagleCPUImpl<double,_1,_0>::upPrePartials
          (BeagleCPUImpl<double,_1,_0> *this,bool byPartition,int *operations,int count,
          int cumulativeScaleIndex)

{
  uint uVar1;
  int *piVar2;
  double **ppdVar3;
  double *pdVar4;
  _func_int **pp_Var5;
  long lVar6;
  double **ppdVar7;
  long lVar8;
  uint uVar9;
  int *piVar10;
  uint *puVar11;
  ulong uVar12;
  undefined7 in_register_00000031;
  double *pdVar13;
  uint uVar14;
  double *pdVar15;
  double *pdVar16;
  bool bVar17;
  double *local_80;
  uint local_78;
  int readScalingIndex;
  double *local_68;
  ulong local_60;
  double *local_58;
  double *local_50;
  double *local_48;
  long local_40;
  int *local_38;
  
  local_38 = &this->kPatternCount;
  puVar11 = (uint *)(operations + 8);
  local_40 = (CONCAT71(in_register_00000031,byPartition) & 0xffffffff) * 8 + 0x1c;
  uVar12 = (ulong)(uint)(~(count >> 0x1f) & count);
  local_78 = cumulativeScaleIndex;
  do {
    bVar17 = uVar12 == 0;
    uVar12 = uVar12 - 1;
    if (bVar17) {
      return 0;
    }
    lVar6 = (long)(int)puVar11[-7];
    lVar8 = (long)(int)puVar11[-8];
    uVar14 = 0;
    local_60 = 0;
    readScalingIndex = puVar11[-6];
    piVar10 = local_38;
    if (byPartition) {
      uVar14 = puVar11[-1];
      local_78 = *puVar11;
      piVar10 = this->gPatternPartitionsStartPatterns + (long)(int)uVar14 + 1;
      local_60 = (ulong)(uint)piVar10[-1];
    }
    ppdVar7 = this->gPartials;
    local_68 = ppdVar7[(int)puVar11[-5]];
    pdVar16 = ppdVar7[(int)puVar11[-3]];
    piVar2 = this->gTipStates[(int)puVar11[-3]];
    ppdVar3 = this->gTransitionMatrices;
    pdVar13 = ppdVar7[lVar8];
    uVar1 = *piVar10;
    pdVar15 = ppdVar3[(int)puVar11[-4]];
    pdVar4 = ppdVar3[(int)puVar11[-2]];
    if ((char)this->kFlags < '\0') {
      this->gActiveScalingFactors[lVar8 - this->kTipCount] = 0;
LAB_0012e14f:
      bVar17 = false;
      local_80 = (double *)0x0;
    }
    else {
      uVar9 = (uint)this->kFlags;
      if ((uVar9 >> 8 & 1) == 0) {
        if ((uVar9 >> 0x19 & 1) == 0) {
          if ((int)puVar11[-7] < 0) {
            if (readScalingIndex < 0) goto LAB_0012e14f;
            bVar17 = false;
            local_80 = this->gScaleBuffers[(uint)readScalingIndex];
            goto LAB_0012e1c7;
          }
          ppdVar7 = this->gScaleBuffers;
        }
        else {
          local_58 = pdVar16;
          local_50 = pdVar15;
          local_48 = pdVar13;
          (*(this->super_BeagleImpl)._vptr_BeagleImpl[0x22])
                    (this,&readScalingIndex,1,(ulong)local_78,ppdVar3,pdVar4);
          ppdVar7 = this->gScaleBuffers;
          pdVar13 = local_48;
          pdVar15 = local_50;
          pdVar16 = local_58;
        }
      }
      else {
        ppdVar7 = this->gScaleBuffers;
        lVar6 = lVar8 - this->kTipCount;
      }
      local_80 = ppdVar7[lVar6];
      bVar17 = true;
    }
LAB_0012e1c7:
    pp_Var5 = (this->super_BeagleImpl)._vptr_BeagleImpl;
    if (piVar2 == (int *)0x0) {
      (*pp_Var5[0x44])(this,pdVar13,local_68,pdVar15,pdVar16,pdVar4,local_60,(ulong)uVar1);
    }
    else {
      (*pp_Var5[0x45])(this,pdVar13,local_68,pdVar15,piVar2,pdVar4,local_60,(ulong)uVar1);
    }
    if (bVar17) {
      pp_Var5 = (this->super_BeagleImpl)._vptr_BeagleImpl;
      if (byPartition) {
        (*pp_Var5[0x5a])(this,pdVar13,local_80,0,0,(ulong)uVar14);
      }
      else {
        (*pp_Var5[0x59])(this,pdVar13,local_80,0,0);
      }
    }
    puVar11 = (uint *)((long)puVar11 + local_40);
  } while( true );
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::upPrePartials(bool byPartition,
                                                     const int* operations,
                                                     int count,
                                                     int cumulativeScaleIndex) {

    REALTYPE* cumulativeScaleBuffer = NULL;  // don't need to normalize/transform back preOrderPartials, off by constant rescaling factor is fine
//    if (cumulativeScaleIndex != BEAGLE_OP_NONE)
//        cumulativeScaleBuffer = gScaleBuffers[cumulativeScaleIndex];

    for (int op = 0; op < count; op++) {

        int numOps = BEAGLE_OP_COUNT;
        if (byPartition)
            numOps = BEAGLE_PARTITION_OP_COUNT;

        if (DEBUGGING_OUTPUT) {
            fprintf(stderr, "op[%d] = ", op);
            for (int j = 0; j < numOps; j++) {
                std::cerr << operations[op*numOps+j] << " ";
            }
            fprintf(stderr, "\n");
        }

        // create a list of partial likelihood update operations
        // the order is [dest, destScaling, source1, matrix1, source2, matrix2]
        // destPartials point to the pre-order partials
        // partials1 = pre-order partials of the parent node
        // matrices1 = Ptr matrices of the current node (to the parent node)
        // partials2 = post-order partials of the sibling node
        // matrices2 = Ptr matrices of the sibling node (to the parent node)
        const int parIndex = operations[op * numOps];
        const int writeScalingIndex = operations[op * numOps + 1];
        const int readScalingIndex = operations[op * numOps + 2];
        const int parentIndex = operations[op * numOps + 3];
        const int parentTransMatIndex = operations[op * numOps + 4];
        const int siblingIndex = operations[op * numOps + 5];
        const int siblingTransMatIndex = operations[op * numOps + 6];
        int currentPartition = 0;
        if (byPartition) {
            currentPartition = operations[op * numOps + 7];
            cumulativeScaleIndex = operations[op * numOps + 8];
//            if (cumulativeScaleIndex != BEAGLE_OP_NONE)
//                cumulativeScaleBuffer = gScaleBuffers[cumulativeScaleIndex];
//            else
//                cumulativeScaleBuffer = NULL;
        }


        /// non-root nodes, can be a tip
        const REALTYPE *partials1 = gPartials[parentIndex];
        const REALTYPE *partials2 = gPartials[siblingIndex];

        const int *tipStates2 = gTipStates[siblingIndex];

        const REALTYPE *matrices1 = gTransitionMatrices[parentTransMatIndex];
        const REALTYPE *matrices2 = gTransitionMatrices[siblingTransMatIndex];


        REALTYPE *destPartials = gPartials[parIndex];

        int startPattern = 0;
        int endPattern = kPatternCount;
        if (byPartition) {
            startPattern = gPatternPartitionsStartPatterns[currentPartition];
            endPattern = gPatternPartitionsStartPatterns[currentPartition + 1];
        }

        int rescale = BEAGLE_OP_NONE;
        REALTYPE *scalingFactors = NULL;

        if (kFlags & BEAGLE_FLAG_SCALING_AUTO) {
            gActiveScalingFactors[parIndex - kTipCount] = 0;
//            if (siblingStates == 0)
                rescale = 2;
        } else if (kFlags & BEAGLE_FLAG_SCALING_ALWAYS) {
            rescale = 1;
            scalingFactors = gScaleBuffers[parIndex - kTipCount];
        } else if (kFlags &
                   BEAGLE_FLAG_SCALING_DYNAMIC) { // TODO: this is a quick and dirty implementation just so it returns correct results
//            if (siblingStates == 0) {
                rescale = 1;
                removeScaleFactors(&readScalingIndex, 1, cumulativeScaleIndex);
                scalingFactors = gScaleBuffers[writeScalingIndex];
//            }
        } else if (writeScalingIndex >= 0) {
            rescale = 1;
            scalingFactors = gScaleBuffers[writeScalingIndex];
        } else if (readScalingIndex >= 0) {
            rescale = 0;
            scalingFactors = gScaleBuffers[readScalingIndex];
        }

        if (DEBUGGING_OUTPUT) {
            std::cerr << "Rescale= " << rescale << " writeIndex= " << writeScalingIndex
                      << " readIndex = " << readScalingIndex << "\n";
        }

        /// destPartials point to the pre-order partials
        /// partials1 = pre-order partials of the parent node
        /// matrices1 = Ptr matrices of the current node (to the parent node)
        /// partials2 = post-order partials of the sibling node
        /// matrices2 = Ptr matrices of the sibling node (to the parent node)
        /// comment out all conditions that's not implemented

        if (tipStates2 != NULL) {
            calcPrePartialsStates(destPartials, partials1, matrices1, tipStates2, matrices2,
                                  startPattern, endPattern);

            if (rescale == 1) {// Recompute scaleFactors
                if (byPartition) {
                    rescalePartialsByPartition(destPartials, scalingFactors, cumulativeScaleBuffer, 0,
                                               currentPartition);
                } else {
                    rescalePartials(destPartials, scalingFactors, cumulativeScaleBuffer, 0);
                }
            }

        } else {
//            if (rescale == 2) {
//                //                    int sIndex = parIndex - kTipCount;
//                //                    calcPartialsPartialsAutoScaling(destPartials,partials1,matrices1,partials2,matrices2,
//                //                                                    &gActiveScalingFactors[sIndex]);
//                //                    if (gActiveScalingFactors[sIndex])
//                //                        autoRescalePartials(destPartials, gAutoScaleBuffers[sIndex]);
//
//            } else if (rescale == 0) {
//                //                    calcPartialsPartialsFixedScaling(destPartials,partials1,matrices1,partials2,
//                //                                                     matrices2,scalingFactors,startPattern,endPattern);
//            } else {

                calcPrePartialsPartials(destPartials, partials1, matrices1, partials2, matrices2,
                                        startPattern, endPattern);

                if (rescale == 1) {// Recompute scaleFactors
                    if (byPartition) {
                        rescalePartialsByPartition(destPartials, scalingFactors, cumulativeScaleBuffer, 0,
                                                   currentPartition);
                    } else {
                        rescalePartials(destPartials, scalingFactors, cumulativeScaleBuffer, 0);
                    }
                }
//            }
        }


//        if (kFlags & BEAGLE_FLAG_SCALING_ALWAYS) {
//            int parScalingIndex = parIndex - kTipCount;
//            int child1ScalingIndex = parentIndex - kTipCount;
//            int child2ScalingIndex = siblingIndex - kTipCount;
//            if (child1ScalingIndex >= 0 && child2ScalingIndex >= 0) {
//                int scalingIndices[2] = {child1ScalingIndex, child2ScalingIndex};
//                accumulateScaleFactors(scalingIndices, 2, parScalingIndex);
//            } else if (child1ScalingIndex >= 0) {
//                int scalingIndices[1] = {child1ScalingIndex};
//                accumulateScaleFactors(scalingIndices, 1, parScalingIndex);
//            } else if (child2ScalingIndex >= 0) {
//                int scalingIndices[1] = {child2ScalingIndex};
//                accumulateScaleFactors(scalingIndices, 1, parScalingIndex);
//            }
//        }

        if (DEBUGGING_OUTPUT) {
            if (scalingFactors != NULL && rescale == 0) {
                for (int i = 0; i < kPatternCount; i++)
                    fprintf(stderr, "old scaleFactor[%d] = %.5f\n", i, scalingFactors[i]);
            }
            fprintf(stderr, "Result partials:\n");
            for (int i = 0; i < kPartialsSize; i++)
                fprintf(stderr, "destP[%d] = %.5f\n", i, destPartials[i]);
        }
    }

    return BEAGLE_SUCCESS;
}